

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daialg.cpp
# Opt level: O0

vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *
libDAI::calcPairBeliefs(InferenceAlgorithm *obj,VarSet *ns,bool reInit)

{
  long lVar1;
  undefined1 auVar2 [16];
  VarSet *pVVar3;
  bool bVar4;
  long *plVar5;
  ulong uVar6;
  TFactor<double> *pTVar7;
  reference pvVar8;
  size_t *psVar9;
  ulong uVar10;
  ostream *poVar11;
  double *pdVar12;
  reference this;
  byte in_CL;
  undefined8 in_RDX;
  long *in_RSI;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *in_RDI;
  undefined1 auVar13 [16];
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  size_t k_2;
  size_t j_2;
  size_t k_val;
  Factor b_k;
  size_t k_1;
  Complex Z;
  double Z_xj;
  size_t j_val;
  size_t j_1;
  Complex logZ0;
  size_t I;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> facs;
  InferenceAlgorithm *clamped;
  size_t k;
  size_t j;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> pairbeliefs;
  const_iterator n;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> vns;
  size_t N;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *result;
  value_type *in_stack_fffffffffffffb38;
  value_type *__x;
  TFactor<double> *in_stack_fffffffffffffb40;
  value_type *in_stack_fffffffffffffb48;
  TFactor<double> *in_stack_fffffffffffffb50;
  VarSet *in_stack_fffffffffffffb58;
  TFactor<double> *in_stack_fffffffffffffb60;
  double dVar17;
  size_type in_stack_fffffffffffffb68;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *in_stack_fffffffffffffb70;
  VarSet *in_stack_fffffffffffffb78;
  VarSet *in_stack_fffffffffffffb80;
  TFactor<double> *in_stack_fffffffffffffb88;
  TFactor<double> *in_stack_fffffffffffffc60;
  TFactor<double> *in_stack_fffffffffffffc68;
  ulong local_238;
  ulong local_230;
  ulong local_220;
  undefined1 local_218 [56];
  size_type local_1e0;
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [16];
  undefined8 local_1a8;
  undefined8 local_1a0;
  TFactor<double> *local_198;
  VarSet *local_190;
  ulong local_188;
  complex<double> local_180;
  _Base_ptr local_170;
  undefined1 local_168;
  ulong local_160;
  long *local_128;
  ulong local_90;
  ulong local_88;
  value_type local_80;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> local_40;
  size_type local_28;
  byte local_19;
  undefined8 local_18;
  long *local_10;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = VarSet::size((VarSet *)0xb3428a);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
            ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)0xb342a7);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::reserve
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)VarSet::begin(&in_stack_fffffffffffffb38->_vs);
  while( true ) {
    local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)VarSet::end(&in_stack_fffffffffffffb38->_vs);
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)in_stack_fffffffffffffb40,
                       (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)in_stack_fffffffffffffb38);
    if (!bVar4) break;
    __gnu_cxx::
    __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
    ::operator*((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                 *)((long)&local_80._p._p.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data + 8));
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::push_back
              ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)in_stack_fffffffffffffb50,
               in_stack_fffffffffffffb48);
    local_80._vs._statespace =
         (size_t)__gnu_cxx::
                 __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                 ::operator++((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                               *)in_stack_fffffffffffffb48,
                              (int)((ulong)in_stack_fffffffffffffb40 >> 0x20));
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb3438f)
  ;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             in_stack_fffffffffffffb80,(size_type)in_stack_fffffffffffffb78);
  for (local_88 = 0; local_88 < local_28; local_88 = local_88 + 1) {
    for (local_90 = 0; local_90 < local_28; local_90 = local_90 + 1) {
      if (local_88 == local_90) {
        TFactor<double>::TFactor(in_stack_fffffffffffffb50);
        std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
                  ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                   in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
        TFactor<double>::~TFactor(in_stack_fffffffffffffb40);
      }
      else {
        std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator[](&local_40,local_88);
        std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator[](&local_40,local_90);
        operator|(in_stack_fffffffffffffb48,(Var *)in_stack_fffffffffffffb40);
        TFactor<double>::TFactor(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
        std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
                  ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                   in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
        TFactor<double>::~TFactor(in_stack_fffffffffffffb40);
        VarSet::~VarSet((VarSet *)0xb34513);
      }
    }
  }
  local_128 = (long *)(**(code **)*local_10)();
  if ((local_19 & 1) == 0) {
    (**(code **)(*local_128 + 0x70))();
  }
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0xb345ea);
  local_160 = 0;
  while( true ) {
    uVar10 = local_160;
    plVar5 = (long *)(**(code **)(*local_128 + 0x28))();
    uVar6 = (**(code **)(*plVar5 + 0x48))();
    if (uVar6 <= uVar10) break;
    plVar5 = (long *)(**(code **)(*local_128 + 0x28))();
    pTVar7 = (TFactor<double> *)(**(code **)(*plVar5 + 0x50))(plVar5,local_160);
    TFactor<double>::vars(pTVar7);
    bVar4 = VarSet::operator&&(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    if (bVar4) {
      pVar14 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)in_stack_fffffffffffffb60,(value_type_conflict2 *)in_stack_fffffffffffffb58
                     );
      local_170 = (_Base_ptr)pVar14.first._M_node;
      local_168 = pVar14.second;
    }
    local_160 = local_160 + 1;
  }
  std::complex<double>::complex(&local_180,0.0,0.0);
  for (local_188 = 0; local_188 < local_28; local_188 = local_188 + 1) {
    local_190 = (VarSet *)0x0;
    while( true ) {
      pVVar3 = local_190;
      pvVar8 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator[]
                         (&local_40,local_188);
      psVar9 = Var::states(pvVar8);
      if ((VarSet *)*psVar9 <= pVVar3) break;
      uVar10 = (**(code **)(*local_10 + 0x30))();
      if (1 < uVar10) {
        poVar11 = (ostream *)std::ostream::operator<<(&std::cout,local_188);
        poVar11 = std::operator<<(poVar11,"/");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_28 - 1);
        poVar11 = std::operator<<(poVar11," (");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,(ulong)local_190);
        poVar11 = std::operator<<(poVar11,"/");
        pvVar8 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator[]
                           (&local_40,local_188);
        psVar9 = Var::states(pvVar8);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,*psVar9);
        std::operator<<(poVar11,"): ");
      }
      in_stack_fffffffffffffc68 = (TFactor<double> *)(**(code **)(*local_128 + 0x28))();
      pvVar8 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator[]
                         (&local_40,local_188);
      (**(code **)((long)((in_stack_fffffffffffffc68->_vs)._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start + 9) + 8))
                (in_stack_fffffffffffffc68,pvVar8,local_190,1);
      if ((local_19 & 1) == 0) {
        (**(code **)(*local_128 + 0x78))(local_128,local_18);
      }
      else {
        (**(code **)(*local_128 + 0x70))();
      }
      (**(code **)(*local_128 + 0x80))();
      local_198 = (TFactor<double> *)0x3ff0000000000000;
      if ((local_188 == 0) && (local_190 == (VarSet *)0x0)) {
        auVar15 = (**(code **)(*local_128 + 0x68))();
        local_180._M_value._0_8_ = auVar15._0_8_;
        auVar2 = auVar15;
      }
      else {
        auVar16 = (**(code **)(*local_128 + 0x68))();
        local_1d8 = auVar16;
        std::operator-((complex<double> *)in_stack_fffffffffffffb38,(complex<double> *)0xb34ac6);
        local_1c8 = auVar16._8_8_;
        local_1c0 = auVar16._0_8_;
        std::exp<double>((complex<double> *)in_stack_fffffffffffffb50);
        local_1b8 = auVar16;
        auVar16._0_8_ = std::imag<double>((complex<double> *)0xb34b50);
        auVar16._8_8_ = 0;
        auVar13._8_8_ = 0x7fffffffffffffff;
        auVar13._0_8_ = 0x7fffffffffffffff;
        auVar16 = vpand_avx(auVar16,auVar13);
        if (1e-05 < auVar16._0_8_) {
          poVar11 = std::operator<<((ostream *)&std::cout,"calcPairBelief::  Warning: complex Z: ");
          poVar11 = std::operator<<(poVar11,(complex *)local_1b8);
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        }
        local_198 = (TFactor<double> *)std::real<double>((complex<double> *)0xb34be0);
        auVar2._8_8_ = local_180._M_value._8_8_;
        auVar2._0_8_ = local_1a8;
        auVar15._8_8_ = local_1a0;
        auVar15._0_8_ = in_stack_fffffffffffffc60;
      }
      local_1e0 = 0;
      while( true ) {
        plVar5 = local_128;
        local_180._M_value._8_8_ = auVar2._8_8_;
        local_1a8 = auVar2._0_8_;
        local_1a0 = auVar15._8_8_;
        in_stack_fffffffffffffc60 = auVar15._0_8_;
        if (local_28 <= local_1e0) break;
        if (local_1e0 != local_188) {
          pvVar8 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator[]
                             (&local_40,local_1e0);
          (**(code **)(*plVar5 + 0x50))(local_218,plVar5,pvVar8);
          local_220 = 0;
          while( true ) {
            pvVar8 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator[]
                               (&local_40,local_1e0);
            psVar9 = Var::states(pvVar8);
            if (*psVar9 <= local_220) break;
            pvVar8 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator[]
                               (&local_40,local_188);
            plVar5 = Var::label(pvVar8);
            lVar1 = *plVar5;
            pvVar8 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator[]
                               (&local_40,local_1e0);
            plVar5 = Var::label(pvVar8);
            pTVar7 = local_198;
            if (lVar1 < *plVar5) {
              pdVar12 = TFactor<double>::operator[]
                                  (in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
              dVar17 = *pdVar12;
              std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
              operator[]((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                          *)&local_80,local_188 * local_28 + local_1e0);
              pvVar8 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator[]
                                 (&local_40,local_188);
              Var::states(pvVar8);
              pdVar12 = TFactor<double>::operator[]
                                  (in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
              *pdVar12 = (double)pTVar7 * dVar17;
            }
            else {
              in_stack_fffffffffffffb88 = local_198;
              pdVar12 = TFactor<double>::operator[]
                                  (in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
              dVar17 = (double)in_stack_fffffffffffffb88 * *pdVar12;
              std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
              operator[]((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                          *)&local_80,local_188 * local_28 + local_1e0);
              in_stack_fffffffffffffb78 = local_190;
              pvVar8 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::operator[]
                                 (&local_40,local_1e0);
              in_stack_fffffffffffffb80 = (VarSet *)Var::states(pvVar8);
              pdVar12 = TFactor<double>::operator[]
                                  (in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
              *pdVar12 = dVar17;
            }
            local_220 = local_220 + 1;
          }
          TFactor<double>::~TFactor(in_stack_fffffffffffffb40);
          auVar2._8_8_ = local_180._M_value._8_8_;
          auVar2._0_8_ = local_1a8;
          auVar15._8_8_ = local_1a0;
          auVar15._0_8_ = in_stack_fffffffffffffc60;
        }
        local_1e0 = local_1e0 + 1;
      }
      in_stack_fffffffffffffb50 = (TFactor<double> *)(**(code **)(*local_128 + 0x28))();
      (*(code *)((_Vector_impl_data *)
                &(in_stack_fffffffffffffb50->_vs)._vars.
                 super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)->_M_start[0xb].
                _label)();
      local_190 = (VarSet *)
                  ((long)&(local_190->_vars).
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start + 1);
    }
  }
  if (local_128 != (long *)0x0) {
    (**(code **)(*local_128 + 0x18))();
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb35040)
  ;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             in_stack_fffffffffffffb80,(size_type)in_stack_fffffffffffffb78);
  for (local_230 = 0; local_238 = local_230, local_230 < local_28; local_230 = local_230 + 1) {
    while (local_238 = local_238 + 1, local_238 < local_28) {
      __x = &local_80;
      this = std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
             operator[]((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         *)__x,local_230 * local_28 + local_238);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)__x,
                 local_238 * local_28 + local_230);
      TFactor<double>::operator*(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      TFactor<double>::operator^(in_stack_fffffffffffffb88,(Real)in_stack_fffffffffffffb80);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)this,
                 __x);
      TFactor<double>::~TFactor(this);
      TFactor<double>::~TFactor(this);
    }
  }
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0xb35233);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             in_stack_fffffffffffffb50);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::~vector
            ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)in_stack_fffffffffffffb50);
  return in_RDI;
}

Assistant:

std::vector<Factor> calcPairBeliefs( const InferenceAlgorithm & obj, const VarSet& ns, bool reInit ) {
        // convert ns to vector<VarSet>
        size_t N = ns.size();
        std::vector<Var> vns;
        vns.reserve( N );
        for( VarSet::const_iterator n = ns.begin(); n != ns.end(); n++ )
            vns.push_back( *n );

        std::vector<Factor> pairbeliefs;
        pairbeliefs.reserve( N * N );
        for( size_t j = 0; j < N; j++ )
            for( size_t k = 0; k < N; k++ )
                if( j == k )
                    pairbeliefs.push_back(Factor());
                else
                    pairbeliefs.push_back(Factor(vns[j] | vns[k]));

        InferenceAlgorithm *clamped = obj.clone();
        if( !reInit )
            clamped->init();

        std::set<size_t> facs;
        for( size_t I = 0; I < clamped->grm().nrFactors(); I++ )
            if( clamped->grm().factor(I).vars() && ns )
                facs.insert( I );

        Complex logZ0;
        for( size_t j = 0; j < N; j++ ) {
            // clamp Var j to its possible values
            for( size_t j_val = 0; j_val < vns[j].states(); j_val++ ) {
                if( obj.Verbose() >= 2 )
                    std::cout << j << "/" << N-1 << " (" << j_val << "/" << vns[j].states() << "): ";

                clamped->grm().clamp( vns[j], j_val, true );
                if( reInit )
                    clamped->init();
                else
                    clamped->init(ns);
                clamped->run();

                //if( j == 0 )
                //  logZ0 = obj.logZ();
                double Z_xj = 1.0;
                if( j == 0 && j_val == 0 ) {
                    logZ0 = clamped->logZ();
                } else {
                    // subtract logZ0 to avoid very large numbers
                    Complex Z = exp(clamped->logZ() - logZ0);
                    if( fabs(imag(Z)) > 1e-5 )
                        std::cout << "calcPairBelief::  Warning: complex Z: " << Z << std::endl;
                    Z_xj = real(Z);
                }

                for( size_t k = 0; k < N; k++ ) 
                    if( k != j ) {
                        Factor b_k = clamped->belief(vns[k]);
                        for( size_t k_val = 0; k_val < vns[k].states(); k_val++ ) 
                            if( vns[j].label() < vns[k].label() )
                                pairbeliefs[j * N + k][j_val + (k_val * vns[j].states())] = Z_xj * b_k[k_val];
                            else
                                pairbeliefs[j * N + k][k_val + (j_val * vns[k].states())] = Z_xj * b_k[k_val];
                    }

                // restore clamped factors
                clamped->grm().restoreFactors();
            }
        }
        
        delete clamped;

        // Calculate result by taking the geometric average
        std::vector<Factor> result;
        result.reserve( N * (N - 1) / 2 );
        for( size_t j = 0; j < N; j++ )
            for( size_t k = j+1; k < N; k++ )
                result.push_back( (pairbeliefs[j * N + k] * pairbeliefs[k * N + j]) ^ 0.5 );

        return result;
    }